

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  char *pcVar1;
  char *pcVar2;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  ulong uVar11;
  archive_acl_entry *paVar12;
  int *piVar13;
  byte bVar14;
  wchar_t wVar15;
  byte *pbVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  undefined8 uVar21;
  wchar_t wVar22;
  ulong uVar23;
  uint uVar24;
  byte *pbVar25;
  bool bVar26;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_f4;
  wchar_t local_f0;
  wchar_t local_ec;
  undefined8 local_e8;
  wchar_t local_e0;
  wchar_t local_dc;
  byte *local_d8;
  uint local_cc;
  byte *local_c8;
  undefined8 local_c0;
  archive_acl *local_b8;
  ulong local_b0;
  archive_string_conv *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  byte *local_88 [5];
  long alStack_60 [6];
  
  local_cc = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_cc = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar9 = L'\0';
  local_b8 = acl;
  if (text == (char *)0x0) {
    local_e0 = L'\0';
  }
  else {
    local_e0 = L'\0';
    local_a8 = sc;
    if (*text != '\0') {
      uVar18 = (ulong)local_cc;
      local_a0 = uVar18 + 0xfffffffe;
      uVar23 = 0;
      local_e0 = L'\0';
      local_dc = want_type;
LAB_001861a2:
      pbVar20 = (byte *)text;
      uVar19 = 0;
      do {
        while ((uVar11 = uVar19, (ulong)*pbVar20 < 0x21 &&
               ((0x100000600U >> ((ulong)*pbVar20 & 0x3f) & 1) != 0))) {
          pbVar20 = pbVar20 + 1;
          uVar19 = uVar11;
        }
        uVar19 = 0;
        while( true ) {
          bVar14 = pbVar20[uVar19];
          if (((ulong)bVar14 < 0x3b) && ((0x400100800000401U >> ((ulong)bVar14 & 0x3f) & 1) != 0))
          break;
          uVar19 = uVar19 + 1;
        }
        pbVar25 = pbVar20 + uVar19;
        pbVar16 = pbVar25;
        for (pbVar3 = pbVar25; (uVar19 != 0 && (pbVar16 = pbVar3, (ulong)pbVar3[-1] < 0x21));
            pbVar3 = pbVar3 + -1) {
          uVar19 = 0x100000600U >> ((ulong)pbVar3[-1] & 0x3f) & 1;
        }
        if (bVar14 == 0x23) {
          while( true ) {
            bVar14 = *pbVar25;
            if (((ulong)bVar14 < 0x2d) && ((0x100000000401U >> ((ulong)bVar14 & 0x3f) & 1) != 0))
            break;
            pbVar25 = pbVar25 + 1;
          }
        }
        text = (char *)(pbVar25 + (*pbVar25 != 0));
        if (uVar11 < uVar18) {
          (&local_98)[uVar11 * 2] = (long *)pbVar20;
          (&local_90)[uVar11 * 2] = (long)pbVar16;
        }
        pbVar20 = (byte *)text;
        uVar19 = uVar11 + 1;
      } while (bVar14 == 0x3a);
      uVar24 = (uint)uVar11;
      local_b0 = uVar23;
      if ((uint)(uVar11 + 1) < local_cc) {
        memset(local_88 + uVar11 * 2,0,(ulong)((int)local_a0 - uVar24) * 0x10 + 0x10);
        want_type = local_dc;
      }
      if ((local_98 != (long *)0x0) && ((char)*local_98 == '#')) {
        uVar23 = local_b0 & 0xffffffff;
        goto LAB_00186b56;
      }
      local_f4 = L'\0';
      if (want_type != L'㰀') {
        local_e8 = 0;
        local_ec = want_type;
        if (((char)*local_98 == 'd') &&
           ((uVar23 = local_90 - (long)local_98, uVar23 == 1 ||
            ((6 < uVar23 &&
             (*(short *)((long)local_98 + 5) == 0x746c && *(int *)((long)local_98 + 1) == 0x75616665
             )))))) {
          local_ec = L'Ȁ';
          if (uVar23 < 8) {
            local_e8 = 1;
          }
          else {
            local_98 = (long *)((long)local_98 + 7);
          }
        }
        iVar7 = (int)local_e8;
        uVar23 = (ulong)((iVar7 + 1U) * 0x10);
        local_d8 = *(byte **)((long)&local_98 + uVar23);
        pbVar20 = *(byte **)((long)&local_90 + uVar23);
        if (local_d8 < pbVar20) {
          pbVar25 = local_d8;
          wVar9 = L'\0';
          do {
            bVar14 = *pbVar25;
            if ((byte)(bVar14 - 0x3a) < 0xf6) goto LAB_001863a1;
            wVar10 = L'\x7fffffff';
            if ((wVar9 < L'\x0ccccccd') && ((wVar9 != L'\x0ccccccc' || ((char)bVar14 < '8')))) {
              wVar10 = (uint)bVar14 + wVar9 * 10 + L'\xffffffd0';
            }
            pbVar25 = pbVar25 + 1;
            wVar9 = wVar10;
          } while (pbVar25 != pbVar20);
        }
        else {
LAB_001863a1:
          wVar10 = L'\xffffffff';
        }
        local_f0 = wVar10;
        if ((wVar10 == L'\xffffffff') && (iVar7 + 3U <= uVar24)) {
          uVar23 = (ulong)((iVar7 + 3U) * 0x10);
          pbVar25 = *(byte **)((long)&local_98 + uVar23);
          pbVar3 = *(byte **)((long)&local_90 + uVar23);
          if (pbVar25 < pbVar3) {
            wVar9 = L'\0';
            do {
              bVar14 = *pbVar25;
              local_f0 = wVar10;
              if ((byte)(bVar14 - 0x3a) < 0xf6) break;
              wVar22 = L'\x7fffffff';
              if ((wVar9 < L'\x0ccccccd') && ((wVar9 != L'\x0ccccccc' || ((char)bVar14 < '8')))) {
                wVar22 = (uint)bVar14 + wVar9 * 10 + L'\xffffffd0';
              }
              wVar9 = wVar22;
              pbVar25 = pbVar25 + 1;
              local_f0 = wVar9;
            } while (pbVar25 != pbVar3);
          }
        }
        pcVar1 = *(char **)((long)&local_98 + (ulong)(uint)(iVar7 << 4));
        pcVar2 = *(char **)((long)&local_90 + (ulong)(uint)(iVar7 << 4));
        uVar23 = 0xffffffec;
        lVar17 = (long)pcVar2 - (long)pcVar1;
        if (pcVar2 == pcVar1) goto LAB_00186b56;
        wVar9 = L'✓';
        switch((int)*pcVar1 - 0x67U >> 1 | (uint)(((int)*pcVar1 - 0x67U & 1) != 0) << 0x1f) {
        case 0:
          uVar21 = 0;
          if ((lVar17 == 1) || ((lVar17 == 5 && (*(int *)(pcVar1 + 1) == 0x70756f72)))) {
            uVar21 = 0x2714;
          }
          break;
        default:
switchD_00186466_caseD_1:
          uVar21 = 0;
          break;
        case 3:
          if ((lVar17 != 1) &&
             ((lVar17 != 4 || (pcVar1[3] != 'k' || *(short *)(pcVar1 + 1) != 0x7361))))
          goto switchD_00186466_caseD_1;
          uVar21 = 0x2715;
          break;
        case 4:
          uVar21 = 0;
          if ((lVar17 == 1) || ((lVar17 == 5 && (*(int *)(pcVar1 + 1) == 0x72656874)))) {
            uVar21 = 0x2716;
          }
          break;
        case 7:
          uVar21 = 0;
          if ((lVar17 == 1) ||
             ((lVar17 == 4 && (uVar21 = 0, pcVar1[3] == 'r' && *(short *)(pcVar1 + 1) == 0x6573))))
          {
            uVar21 = 0x2712;
            wVar9 = L'✑';
          }
        }
        iVar8 = (int)uVar21;
        if (iVar8 - 0x2715U < 2) {
          if ((iVar7 + 1U == uVar24 && local_d8 < pbVar20) &&
             (local_c8 = pbVar20, local_c0 = uVar21,
             wVar9 = ismode((char *)local_d8,(char *)pbVar20,&local_f4), pbVar20 = local_c8,
             uVar21 = local_c0, want_type = local_dc, wVar9 != L'\0')) {
            iVar8 = -1;
            pbVar20 = (byte *)0x0;
            local_d8 = (byte *)0x0;
            wVar9 = (wchar_t)local_c0;
            iVar7 = (int)local_e8;
          }
          else {
            uVar23 = 0xffffffec;
            iVar7 = (int)local_e8;
            if (iVar7 + 2U == uVar24) {
              if (pbVar20 <= local_d8) goto LAB_00186995;
              goto LAB_00186b56;
            }
            pbVar20 = (byte *)0x0;
            local_d8 = (byte *)0x0;
            iVar8 = 0;
            wVar9 = (wchar_t)uVar21;
          }
        }
        else {
          if ((iVar8 != 0x2712) && (iVar8 != 0x2714)) goto LAB_00186b56;
          iVar8 = 0;
          if ((pbVar20 <= local_d8) && (local_f0 == L'\xffffffff')) {
LAB_00186995:
            iVar8 = 0;
            local_d8 = (byte *)0x0;
            pbVar20 = (byte *)0x0;
            wVar9 = (wchar_t)uVar21;
          }
        }
        local_c8 = pbVar20;
        if ((local_f4 == L'\0') &&
           (uVar23 = (ulong)(iVar8 + iVar7 + 2),
           wVar10 = ismode((char *)(&local_98)[uVar23 * 2],(char *)(&local_90)[uVar23 * 2],&local_f4
                          ), want_type = local_dc, wVar10 == L'\0')) goto LAB_00186a16;
        goto LAB_00186a87;
      }
      bVar14 = 0;
      bVar26 = true;
      switch(local_90 - (long)local_98) {
      case 4:
        bVar14 = 0;
        bVar6 = 0;
        wVar9 = L'\0';
        if ((int)*local_98 == 0x72657375) {
          wVar9 = L'✑';
          bVar14 = 1;
          bVar26 = false;
          goto LAB_0018660a;
        }
        break;
      case 5:
        bVar14 = 0;
        bVar6 = 0;
        wVar9 = L'\0';
        if (*(char *)((long)local_98 + 4) == 'p' && (int)*local_98 == 0x756f7267) {
          wVar9 = L'✓';
          bVar6 = 1;
          bVar26 = false;
          bVar14 = 0;
        }
        break;
      case 6:
        bVar26 = false;
        if (*(short *)((long)local_98 + 4) == 0x4072 && (int)*local_98 == 0x656e776f) {
          wVar9 = L'✒';
          bVar14 = 0;
        }
        else {
          bVar4 = *(short *)((long)local_98 + 4) != 0x4070;
          bVar5 = (int)*local_98 != 0x756f7267;
          bVar26 = bVar4 || bVar5;
          wVar9 = L'✔';
          if (bVar4 || bVar5) {
            wVar9 = L'\0';
          }
          bVar14 = 0;
        }
        goto LAB_0018660a;
      default:
        bVar6 = 0;
        wVar9 = L'\0';
        break;
      case 9:
        bVar14 = 0;
        bVar4 = (char)local_98[1] != '@';
        bVar26 = bVar4 || *local_98 != 0x656e6f7972657665;
        wVar9 = L'❻';
        if (bVar4 || *local_98 != 0x656e6f7972657665) {
          wVar9 = L'\0';
        }
LAB_0018660a:
        bVar6 = 0;
      }
      uVar23 = 0xffffffec;
      if (!bVar26) {
        local_e8 = CONCAT44(local_e8._4_4_,wVar9);
        wVar22 = L'\xffffffff';
        wVar10 = wVar22;
        if ((bool)(bVar14 | bVar6)) {
          iVar7 = 1;
          local_d8 = local_88[0];
          pbVar20 = local_88[1];
          if (local_88[0] < local_88[1]) {
            wVar15 = L'\0';
            pbVar25 = local_88[0];
            do {
              bVar14 = *pbVar25;
              wVar10 = wVar22;
              if ((byte)(bVar14 - 0x3a) < 0xf6) break;
              wVar10 = L'\x7fffffff';
              if ((wVar15 < L'\x0ccccccd') && ((wVar15 != L'\x0ccccccc' || ((char)bVar14 < '8')))) {
                wVar10 = (uint)bVar14 + wVar15 * 10 + L'\xffffffd0';
              }
              wVar15 = wVar10;
              pbVar25 = pbVar25 + 1;
              wVar10 = wVar15;
            } while (pbVar25 != local_88[1]);
          }
        }
        else {
          local_d8 = (byte *)0x0;
          iVar7 = 0;
          pbVar20 = (byte *)0x0;
        }
        uVar23 = (ulong)(uint)(iVar7 << 4);
        pbVar25 = *(byte **)((long)local_88 + uVar23);
        pbVar3 = *(byte **)((long)local_88 + uVar23 + 8);
        if (pbVar25 < pbVar3) {
          local_f4 = L'\0';
          do {
            bVar14 = *pbVar25;
            if (bVar14 < 99) {
              if (bVar14 < 0x44) {
                if (bVar14 != 0x2d) {
                  if (bVar14 == 0x41) {
                    local_f4 = local_f4 | 0x400;
                  }
                  else {
                    if (bVar14 != 0x43) goto switchD_001866ed_caseD_71;
                    local_f4 = local_f4 | 0x2000;
                  }
                }
              }
              else if (bVar14 < 0x57) {
                if (bVar14 == 0x44) {
                  local_f4 = local_f4 | 0x100;
                }
                else {
                  if (bVar14 != 0x52) goto switchD_001866ed_caseD_71;
                  local_f4 = local_f4 | 0x40;
                }
              }
              else if (bVar14 == 0x57) {
                local_f4 = local_f4 | 0x80;
              }
              else {
                if (bVar14 != 0x61) goto switchD_001866ed_caseD_71;
                local_f4 = local_f4 | 0x200;
              }
            }
            else {
              switch(bVar14) {
              case 0x6f:
                local_f4 = local_f4 | 0x4000;
                break;
              case 0x70:
                local_f4 = local_f4 | 0x20;
                break;
              case 0x71:
              case 0x74:
              case 0x75:
              case 0x76:
                goto switchD_001866ed_caseD_71;
              case 0x72:
                local_f4 = local_f4 | 8;
                break;
              case 0x73:
                local_f4 = local_f4 | 0x8000;
                break;
              case 0x77:
                local_f4 = local_f4 | 0x10;
                break;
              case 0x78:
                local_f4 = local_f4 | 1;
                break;
              default:
                if (bVar14 == 99) {
                  local_f4 = local_f4 | 0x1000;
                }
                else {
                  if (bVar14 != 100) goto switchD_001866ed_caseD_71;
                  local_f4 = local_f4 | 0x800;
                }
              }
            }
            pbVar25 = pbVar25 + 1;
          } while (pbVar25 != pbVar3);
        }
        pbVar25 = *(byte **)((long)local_88 + uVar23 + 0x10);
        pbVar3 = *(byte **)((long)local_88 + uVar23 + 0x18);
        if (pbVar25 < pbVar3) {
          do {
            bVar14 = *pbVar25;
            if (bVar14 < 100) {
              if (bVar14 < 0x49) {
                if (bVar14 != 0x2d) {
                  if (bVar14 != 0x46) goto switchD_001866ed_caseD_71;
                  local_f4 = local_f4 | 0x40000000;
                }
              }
              else if (bVar14 == 0x49) {
                local_f4 = local_f4 | 0x1000000;
              }
              else {
                if (bVar14 != 0x53) goto switchD_001866ed_caseD_71;
                local_f4 = local_f4 | 0x20000000;
              }
            }
            else if (bVar14 < 0x69) {
              if (bVar14 == 100) {
                local_f4 = local_f4 | 0x4000000;
              }
              else {
                if (bVar14 != 0x66) goto switchD_001866ed_caseD_71;
                local_f4 = local_f4 | 0x2000000;
              }
            }
            else if (bVar14 == 0x69) {
              local_f4 = local_f4 | 0x10000000;
            }
            else {
              if (bVar14 != 0x6e) goto switchD_001866ed_caseD_71;
              local_f4 = local_f4 | 0x8000000;
            }
            pbVar25 = pbVar25 + 1;
          } while (pbVar25 != pbVar3);
        }
        piVar13 = *(int **)((long)local_88 + uVar23 + 0x20);
        lVar17 = *(long *)((long)alStack_60 + uVar23) - (long)piVar13;
        if (lVar17 == 5) {
          if ((char)piVar13[1] == 'w' && *piVar13 == 0x6f6c6c61) {
            wVar22 = L'Ѐ';
          }
          else {
            if ((char)piVar13[1] != 't' || *piVar13 != 0x69647561) {
              bVar4 = (char)piVar13[1] == 'm';
              bVar26 = !bVar4 || *piVar13 != 0x72616c61;
              wVar22 = (uint)(bVar4 && *piVar13 == 0x72616c61) << 0xd;
              goto LAB_00186a12;
            }
            wVar22 = L'က';
          }
          bVar26 = false;
        }
        else {
          wVar22 = L'\0';
          if (lVar17 == 4) {
            bVar26 = *piVar13 != 0x796e6564;
            wVar22 = (uint)(*piVar13 == 0x796e6564) << 0xb;
          }
          else {
            bVar26 = true;
          }
        }
LAB_00186a12:
        if (!bVar26) {
          pbVar25 = *(byte **)((long)alStack_60 + uVar23 + 8);
          pbVar3 = *(byte **)((long)alStack_60 + uVar23 + 0x10);
          local_f0 = wVar10;
          local_ec = wVar22;
          local_c8 = pbVar20;
          if (pbVar25 < pbVar3) {
            wVar22 = L'\0';
            do {
              bVar14 = *pbVar25;
              local_f0 = wVar10;
              if ((byte)(bVar14 - 0x3a) < 0xf6) break;
              local_f0 = L'\x7fffffff';
              if ((wVar22 < L'\x0ccccccd') && ((wVar22 != L'\x0ccccccc' || ((char)bVar14 < '8')))) {
                local_f0 = (uint)bVar14 + wVar22 * 10 + L'\xffffffd0';
              }
              pbVar25 = pbVar25 + 1;
              wVar22 = local_f0;
            } while (pbVar25 != pbVar3);
          }
LAB_00186a87:
          wVar10 = local_ec;
          local_e8 = CONCAT44(local_e8._4_4_,wVar9);
          local_c0 = CONCAT44(local_c0._4_4_,local_f4);
          wVar22 = acl_special(local_b8,local_ec,local_f4,wVar9);
          wVar9 = L'\0';
          if (wVar22 != L'\0') {
            paVar12 = acl_new_entry(local_b8,wVar10,(wchar_t)local_c0,(wchar_t)local_e8,local_f0);
            if (paVar12 == (archive_acl_entry *)0x0) {
              wVar9 = L'\xffffffe7';
            }
            else if (((local_d8 == (byte *)0x0) || (local_c8 == local_d8)) || (*local_d8 == 0)) {
              archive_mstring_clean(&paVar12->name);
              wVar9 = L'\0';
            }
            else {
              wVar22 = archive_mstring_copy_mbs_len_l
                                 (&paVar12->name,(char *)local_d8,(long)local_c8 - (long)local_d8,
                                  local_a8);
              wVar9 = L'\0';
              if (wVar22 != L'\0') {
                piVar13 = __errno_location();
                wVar9 = L'\xffffffec';
                if (*piVar13 == 0xc) {
                  wVar9 = L'\xffffffe2';
                }
              }
            }
          }
          if (wVar9 < L'\xffffffec') {
            return wVar9;
          }
          uVar24 = (uint)local_b0;
          if (wVar9 != L'\0') {
            uVar24 = 0xffffffec;
          }
          local_e0 = local_e0 | wVar10;
          uVar23 = (ulong)uVar24;
          want_type = local_dc;
          goto LAB_00186b56;
        }
        goto LAB_00186a16;
      }
      goto LAB_00186b56;
    }
  }
LAB_00186b6d:
  archive_acl_reset(local_b8,local_e0);
  return wVar9;
switchD_001866ed_caseD_71:
LAB_00186a16:
  uVar23 = 0xffffffec;
LAB_00186b56:
  wVar9 = (wchar_t)uVar23;
  if (*text == 0) goto LAB_00186b6d;
  goto LAB_001861a2;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			if (len == 0) {
				ret = ARCHIVE_WARN;
				continue;
			}

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}